

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

resolve_t Curl_resolv(connectdata *conn,char *hostname,int port,_Bool allowDOH,
                     Curl_dns_entry **entry)

{
  Curl_easy *data_00;
  _Bool _Var1;
  int iVar2;
  CURLcode CVar3;
  undefined1 local_6c [8];
  in6_addr in6;
  int st;
  in_addr in;
  int respwait;
  Curl_addrinfo *addr;
  resolve_t rc;
  CURLcode result;
  Curl_easy *data;
  Curl_dns_entry *dns;
  Curl_dns_entry **entry_local;
  _Bool allowDOH_local;
  char *pcStack_20;
  int port_local;
  char *hostname_local;
  connectdata *conn_local;
  
  data = (Curl_easy *)0x0;
  data_00 = conn->data;
  addr._0_4_ = CURLRESOLV_ERROR;
  *entry = (Curl_dns_entry *)0x0;
  dns = (Curl_dns_entry *)entry;
  entry_local._3_1_ = allowDOH;
  entry_local._4_4_ = port;
  pcStack_20 = hostname;
  hostname_local = (char *)conn;
  if (data_00->share != (Curl_share *)0x0) {
    Curl_share_lock(data_00,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
  }
  data = (Curl_easy *)fetch_addr((connectdata *)hostname_local,pcStack_20,entry_local._4_4_);
  if (data != (Curl_easy *)0x0) {
    Curl_infof(data_00,"Hostname %s was found in DNS cache\n",pcStack_20);
    data->conn = (connectdata *)((long)&data->conn->data + 1);
    addr._0_4_ = CURLRESOLV_RESOLVED;
  }
  if (data_00->share != (Curl_share *)0x0) {
    Curl_share_unlock(data_00,CURL_LOCK_DATA_DNS);
  }
  if (data == (Curl_easy *)0x0) {
    _in = (Curl_addrinfo *)0x0;
    st = 0;
    if ((data_00->set).resolver_start != (curl_resolver_start_callback)0x0) {
      Curl_set_in_callback(data_00,true);
      in6.__in6_u.__u6_addr32[2] =
           (*(data_00->set).resolver_start)
                     ((data_00->state).resolver,(void *)0x0,(data_00->set).resolver_start_client);
      Curl_set_in_callback(data_00,false);
      if (in6.__in6_u.__u6_addr32[2] != 0) {
        return CURLRESOLV_ERROR;
      }
    }
    iVar2 = inet_pton(2,pcStack_20,(void *)((long)&in6.__in6_u + 0xc));
    if (0 < iVar2) {
      _in = Curl_ip2addr(2,(void *)((long)&in6.__in6_u + 0xc),pcStack_20,entry_local._4_4_);
    }
    if ((_in == (Curl_addrinfo *)0x0) && (iVar2 = inet_pton(10,pcStack_20,local_6c), 0 < iVar2)) {
      _in = Curl_ip2addr(10,local_6c,pcStack_20,entry_local._4_4_);
    }
    if (_in == (Curl_addrinfo *)0x0) {
      _Var1 = Curl_ipvalid((connectdata *)hostname_local);
      if (!_Var1) {
        return CURLRESOLV_ERROR;
      }
      if (((entry_local._3_1_ & 1) == 0) ||
         ((*(ulong *)&(data_00->set).field_0x910 >> 0x37 & 1) == 0)) {
        _in = Curl_getaddrinfo((connectdata *)hostname_local,pcStack_20,entry_local._4_4_,&st);
      }
      else {
        _in = Curl_doh((connectdata *)hostname_local,pcStack_20,entry_local._4_4_,&st);
      }
    }
    if (_in == (Curl_addrinfo *)0x0) {
      if (st != 0) {
        CVar3 = Curl_resolv_check((connectdata *)hostname_local,(Curl_dns_entry **)&data);
        if (CVar3 != CURLE_OK) {
          return CURLRESOLV_ERROR;
        }
        addr._0_4_ = (resolve_t)(data == (Curl_easy *)0x0);
      }
    }
    else {
      if (data_00->share != (Curl_share *)0x0) {
        Curl_share_lock(data_00,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
      }
      data = (Curl_easy *)Curl_cache_addr(data_00,_in,pcStack_20,entry_local._4_4_);
      if (data_00->share != (Curl_share *)0x0) {
        Curl_share_unlock(data_00,CURL_LOCK_DATA_DNS);
      }
      if (data == (Curl_easy *)0x0) {
        Curl_freeaddrinfo(_in);
      }
      else {
        addr._0_4_ = CURLRESOLV_RESOLVED;
      }
    }
  }
  dns->addr = (Curl_addrinfo *)data;
  return (resolve_t)addr;
}

Assistant:

enum resolve_t Curl_resolv(struct connectdata *conn,
                           const char *hostname,
                           int port,
                           bool allowDOH,
                           struct Curl_dns_entry **entry)
{
  struct Curl_dns_entry *dns = NULL;
  struct Curl_easy *data = conn->data;
  CURLcode result;
  enum resolve_t rc = CURLRESOLV_ERROR; /* default to failure */

  *entry = NULL;

  if(data->share)
    Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

  dns = fetch_addr(conn, hostname, port);

  if(dns) {
    infof(data, "Hostname %s was found in DNS cache\n", hostname);
    dns->inuse++; /* we use it! */
    rc = CURLRESOLV_RESOLVED;
  }

  if(data->share)
    Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

  if(!dns) {
    /* The entry was not in the cache. Resolve it to IP address */

    Curl_addrinfo *addr = NULL;
    int respwait = 0;
#ifndef USE_RESOLVE_ON_IPS
    struct in_addr in;
#endif

    /* notify the resolver start callback */
    if(data->set.resolver_start) {
      int st;
      Curl_set_in_callback(data, true);
      st = data->set.resolver_start(data->state.resolver, NULL,
                                    data->set.resolver_start_client);
      Curl_set_in_callback(data, false);
      if(st)
        return CURLRESOLV_ERROR;
    }

#ifndef USE_RESOLVE_ON_IPS
    /* First check if this is an IPv4 address string */
    if(Curl_inet_pton(AF_INET, hostname, &in) > 0)
      /* This is a dotted IP address 123.123.123.123-style */
      addr = Curl_ip2addr(AF_INET, &in, hostname, port);
#ifdef ENABLE_IPV6
    if(!addr) {
      struct in6_addr in6;
      /* check if this is an IPv6 address string */
      if(Curl_inet_pton(AF_INET6, hostname, &in6) > 0)
        /* This is an IPv6 address literal */
        addr = Curl_ip2addr(AF_INET6, &in6, hostname, port);
    }
#endif /* ENABLE_IPV6 */
#endif /* !USE_RESOLVE_ON_IPS */

    if(!addr) {
      /* Check what IP specifics the app has requested and if we can provide
       * it. If not, bail out. */
      if(!Curl_ipvalid(conn))
        return CURLRESOLV_ERROR;

      if(allowDOH && data->set.doh) {
        addr = Curl_doh(conn, hostname, port, &respwait);
      }
      else {
        /* If Curl_getaddrinfo() returns NULL, 'respwait' might be set to a
           non-zero value indicating that we need to wait for the response to
           the resolve call */
        addr = Curl_getaddrinfo(conn,
#ifdef DEBUGBUILD
                                (data->set.str[STRING_DEVICE]
                                 && !strcmp(data->set.str[STRING_DEVICE],
                                            "LocalHost"))?"localhost":
#endif
                                hostname, port, &respwait);
      }
    }
    if(!addr) {
      if(respwait) {
        /* the response to our resolve call will come asynchronously at
           a later time, good or bad */
        /* First, check that we haven't received the info by now */
        result = Curl_resolv_check(conn, &dns);
        if(result) /* error detected */
          return CURLRESOLV_ERROR;
        if(dns)
          rc = CURLRESOLV_RESOLVED; /* pointer provided */
        else
          rc = CURLRESOLV_PENDING; /* no info yet */
      }
    }
    else {
      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* we got a response, store it in the cache */
      dns = Curl_cache_addr(data, addr, hostname, port);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns)
        /* returned failure, bail out nicely */
        Curl_freeaddrinfo(addr);
      else
        rc = CURLRESOLV_RESOLVED;
    }
  }

  *entry = dns;

  return rc;
}